

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

bool __thiscall FNodeBuilder::GetPolyExtents(FNodeBuilder *this,int polynum,fixed_t *bbox)

{
  int iVar1;
  int iVar2;
  line_t_conflict *plVar3;
  FPrivSeg *pFVar4;
  FPrivVert *pFVar5;
  uint uVar6;
  FPrivVert *pFVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  long lVar12;
  bool bVar13;
  
  bbox[2] = 0x7fffffff;
  bbox[3] = -0x80000000;
  bbox[0] = -0x80000000;
  bbox[1] = 0x7fffffff;
  uVar8 = (ulong)(this->Segs).Count;
  bVar13 = uVar8 != 0;
  if (bVar13) {
    plVar3 = this->Level->Lines;
    uVar10 = 1;
    lVar12 = 0;
    do {
      iVar1 = *(int *)((long)&((this->Segs).Array)->linedef + lVar12);
      if ((plVar3[iVar1].special == 1) && (plVar3[iVar1].args[0] == polynum)) {
        if (bVar13) {
          pFVar4 = (this->Segs).Array;
          pFVar7 = (this->Vertices).Array;
          uVar9 = *(uint *)((long)&pFVar4->v1 + lVar12);
          iVar1 = pFVar7[uVar9].super_FSimpleVert.x;
          iVar2 = pFVar7[uVar9].super_FSimpleVert.y;
          AddSegToBBox(this,bbox,(FPrivSeg *)((long)&pFVar4->v1 + lVar12));
          pFVar7 = (this->Vertices).Array;
          uVar9 = *(uint *)((long)&((this->Segs).Array)->v2 + lVar12);
          uVar6 = pFVar7[uVar9].segs;
          if (uVar6 == 0xffffffff) {
            return true;
          }
          pFVar7 = pFVar7 + uVar9;
          uVar9 = 1;
          do {
            if (((pFVar7->super_FSimpleVert).x ==
                 SUB84((double)iVar1 * 1.52587890625e-05 + 103079215104.0,0)) &&
               ((pFVar7->super_FSimpleVert).y ==
                SUB84((double)iVar2 * 1.52587890625e-05 + 103079215104.0,0))) {
              return true;
            }
            if ((this->Segs).Count <= uVar9) {
              return true;
            }
            AddSegToBBox(this,bbox,(this->Segs).Array + uVar6);
            pFVar5 = (this->Vertices).Array;
            uVar6 = (this->Segs).Array[uVar6].v2;
            pFVar7 = pFVar5 + uVar6;
            uVar6 = pFVar5[uVar6].segs;
            uVar9 = uVar9 + 1;
          } while (uVar6 != 0xffffffff);
          return true;
        }
        break;
      }
      bVar13 = uVar10 < uVar8;
      lVar12 = lVar12 + 0x48;
      uVar10 = uVar10 + 1;
    } while (uVar8 * 0x48 != lVar12);
  }
  puVar11 = &(this->Segs).Count;
  if (*puVar11 != 0) {
    lVar12 = 0;
    uVar8 = 0;
    bVar13 = false;
    do {
      pFVar4 = (this->Segs).Array;
      plVar3 = this->Level->Lines;
      iVar1 = *(int *)((long)&pFVar4->linedef + lVar12);
      if ((plVar3[iVar1].special == 5) && (plVar3[iVar1].args[0] == polynum)) {
        AddSegToBBox(this,bbox,(FPrivSeg *)((long)&pFVar4->v1 + lVar12));
        bVar13 = true;
      }
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 0x48;
    } while (uVar8 < *puVar11);
    return bVar13;
  }
  return false;
}

Assistant:

bool FNodeBuilder::GetPolyExtents (int polynum, fixed_t bbox[4])
{
	unsigned int i;

	bbox[BOXLEFT] = bbox[BOXBOTTOM] = FIXED_MAX;
	bbox[BOXRIGHT] = bbox[BOXTOP] = FIXED_MIN;

	// Try to find a polyobj marked with a start line
	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_START &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			break;
		}
	}

	if (i < Segs.Size())
	{
		vertex_t start;
		unsigned int vert;
		unsigned int count = 0;

		vert = Segs[i].v1;

		start.set(Vertices[vert].x, Vertices[vert].y);

		do
		{
			AddSegToBBox (bbox, &Segs[i]);
			vert = Segs[i].v2;
			i = Vertices[vert].segs;
			count++;	// to prevent endless loops. Stop when this reaches the number of segs.
		} while (i != DWORD_MAX && (Vertices[vert].x != start.fixX() || Vertices[vert].y != start.fixY()) && count < Segs.Size());

		return true;
	}

	// Try to find a polyobj marked with explicit lines
	bool found = false;

	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_EXPLICIT &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			AddSegToBBox (bbox, &Segs[i]);
			found = true;
		}
	}
	return found;
}